

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

bool __thiscall
ON_SimpleArray<ON_SubDComponentId>::QuickSortAndRemoveDuplicates
          (ON_SimpleArray<ON_SubDComponentId> *this,
          _func_int_ON_SubDComponentId_ptr_ON_SubDComponentId_ptr *compar)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ON_SubDComponentId *pOVar4;
  int iVar5;
  long lVar6;
  
  if (this->m_a != (ON_SubDComponentId *)0x0) {
    iVar1 = this->m_count;
    if (compar != (_func_int_ON_SubDComponentId_ptr_ON_SubDComponentId_ptr *)0x0 && 0 < (long)iVar1)
    {
      if (iVar1 < 2) {
        return true;
      }
      lVar3 = 8;
      ON_qsort(this->m_a,(long)iVar1,8,(_func_int_void_ptr_void_ptr *)compar);
      iVar1 = this->m_count;
      iVar5 = 1;
      if (1 < iVar1) {
        pOVar4 = this->m_a;
        iVar5 = 1;
        lVar2 = 1;
        do {
          iVar1 = (*compar)(pOVar4,(ON_SubDComponentId *)(this->m_a->m_valueAB + lVar3 + -5));
          if (iVar1 != 0) {
            lVar6 = (long)iVar5;
            if (lVar6 < lVar2) {
              this->m_a[lVar6] = this->m_a[lVar2];
            }
            pOVar4 = this->m_a + lVar6;
            iVar5 = iVar5 + 1;
          }
          lVar2 = lVar2 + 1;
          iVar1 = this->m_count;
          lVar3 = lVar3 + 8;
        } while (lVar2 < iVar1);
      }
      if (iVar1 - iVar5 == 0 || iVar1 < iVar5) {
        return true;
      }
      memset(this->m_a + iVar5,0,(long)(iVar1 - iVar5) << 3);
      if (iVar5 < 0) {
        return true;
      }
      if (this->m_capacity < iVar5) {
        return true;
      }
      this->m_count = iVar5;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_SimpleArray<T>::QuickSortAndRemoveDuplicates( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar )
  {
    if (m_count > 1)
    {
      ON_qsort(m_a, m_count, sizeof(T), (int(*)(const void*, const void*))compar);
      const T* prev_ele = &m_a[0];
      int clean_count = 1;
      for (int i = 1; i < m_count; ++i)
      {
        if (0 == compar(prev_ele, &m_a[i]))
          continue; // duplicate
        if (i > clean_count)
          m_a[clean_count] = m_a[i];
        prev_ele = &m_a[clean_count];
        ++clean_count;
      }
      if (clean_count < m_count)
      {
        memset( (void*)(&m_a[clean_count]), 0, (m_count-clean_count)*sizeof(T) );
        SetCount(clean_count);
      }
    }
    rc = true;
  }
  return rc;
}